

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result wabt::WastParser::ResolveRefTypes
                 (Module *module,TypeVector *types,ReferenceVars *ref_vars,Errors *errors)

{
  vector<wabt::Error,std::allocator<wabt::Error>> *this;
  bool bVar1;
  Index IVar2;
  Enum e;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  string *name;
  Var *__args_1;
  undefined8 uVar6;
  value_type local_9c;
  Result local_94;
  string local_90;
  ErrorLevel local_6c;
  Index local_68;
  value_type vStack_64;
  Index type_index;
  Type type;
  uint32_t index;
  ReferenceVar *ref_var;
  iterator __end1;
  iterator __begin1;
  ReferenceVars *__range1;
  vector<wabt::Error,std::allocator<wabt::Error>> *pvStack_30;
  Result result;
  Errors *errors_local;
  ReferenceVars *ref_vars_local;
  TypeVector *types_local;
  Module *module_local;
  
  pvStack_30 = (vector<wabt::Error,std::allocator<wabt::Error>> *)errors;
  Result::Result((Result *)((long)&__range1 + 4),Ok);
  __end1 = std::
           vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>::
           begin(ref_vars);
  ref_var = (ReferenceVar *)
            std::
            vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
            ::end(ref_vars);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<wabt::WastParser::ReferenceVar_*,_std::vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>_>
                                *)&ref_var);
    if (!bVar1) {
      Result::Result((Result *)((long)&module_local + 4),Ok);
      return (Result)module_local._4_4_;
    }
    register0x00000000 =
         __gnu_cxx::
         __normal_iterator<wabt::WastParser::ReferenceVar_*,_std::vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>_>
         ::operator*(&__end1);
    type.enum_ = register0x00000000->index;
    if (type.enum_ != I32) {
      uVar3 = (ulong)(uint)type.enum_;
      sVar4 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(types);
      if (sVar4 <= uVar3) {
        __assert_fail("index < types->size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                      ,0x51e,
                      "static Result wabt::WastParser::ResolveRefTypes(const Module &, TypeVector *, ReferenceVars *, Errors *)"
                     );
      }
      pvVar5 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[]
                         (types,(ulong)(uint)type.enum_);
      vStack_64 = *pvVar5;
      stack0xffffffffffffffa8->index = 0xffffffff;
      bVar1 = Type::IsReferenceWithIndex(&stack0xffffffffffffff9c);
      if (!bVar1) {
        __assert_fail("type.IsReferenceWithIndex()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                      ,0x522,
                      "static Result wabt::WastParser::ResolveRefTypes(const Module &, TypeVector *, ReferenceVars *, Errors *)"
                     );
      }
      IVar2 = Type::GetReferenceIndex(&stack0xffffffffffffff9c);
      if (IVar2 == 0xffffffff) {
        name = Var::name_abi_cxx11_(&stack0xffffffffffffffa8->var);
        local_68 = BindingHash::FindIndex(&module->type_bindings,name);
        this = pvStack_30;
        if (local_68 == 0xffffffff) {
          local_6c = Error;
          __args_1 = &stack0xffffffffffffffa8->var;
          Var::name_abi_cxx11_(&stack0xffffffffffffffa8->var);
          uVar6 = std::__cxx11::string::c_str();
          StringPrintf_abi_cxx11_(&local_90,"undefined reference type name %s",uVar6);
          std::vector<wabt::Error,std::allocator<wabt::Error>>::
          emplace_back<wabt::ErrorLevel,wabt::Location&,std::__cxx11::string>
                    (this,&local_6c,&__args_1->loc,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          Result::Result(&local_94,Error);
          __range1._4_4_ = local_94.enum_;
        }
        else {
          e = Type::operator_cast_to_Enum(&stack0xffffffffffffff9c);
          Type::Type(&local_9c,e,local_68);
          pvVar5 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[]
                             (types,(ulong)(uint)type.enum_);
          *pvVar5 = local_9c;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<wabt::WastParser::ReferenceVar_*,_std::vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

Result WastParser::ResolveRefTypes(const Module& module,
                                   TypeVector* types,
                                   ReferenceVars* ref_vars,
                                   Errors* errors) {
  Result result = Result::Ok;

  for (auto& ref_var : *ref_vars) {
    uint32_t index = ref_var.index;

    // The index of resolved variables is converted to kInvalidIndex.
    if (index == kInvalidIndex) {
      continue;
    }

    assert(index < types->size());
    Type type = (*types)[index];
    ref_var.index = kInvalidIndex;

    assert(type.IsReferenceWithIndex());

    if (type.GetReferenceIndex() != kInvalidIndex) {
      continue;
    }

    const auto type_index = module.type_bindings.FindIndex(ref_var.var.name());

    if (type_index == kInvalidIndex) {
      errors->emplace_back(ErrorLevel::Error, ref_var.var.loc,
                           StringPrintf("undefined reference type name %s",
                                        ref_var.var.name().c_str()));
      result = Result::Error;
      continue;
    }

    (*types)[index] = Type(static_cast<Type::Enum>(type), type_index);
  }

  return Result::Ok;
}